

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batchnorm_x86_avx512.cpp
# Opt level: O0

int __thiscall
ncnn::BatchNorm_x86_avx512::forward_inplace
          (BatchNorm_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  long lVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  undefined8 *puVar16;
  long *in_RSI;
  long in_RDI;
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  __m128 _p128_2;
  __m256 _p256_2;
  __m512 _p512_2;
  int i_2;
  __m512 _b512_2;
  __m512 _a512_2;
  __m256 _b256_2;
  __m256 _a256_2;
  __m128 _b128_2;
  __m128 _a128_2;
  float b_1;
  float a_1;
  float *ptr_2;
  int q;
  int size_2;
  __m128 _p128_1;
  __m256 _p256_1;
  __m512 _p512_1;
  int j;
  __m512 _b512_1;
  __m512 _a512_1;
  __m256 _b256_1;
  __m256 _a256_1;
  __m128 _b128_1;
  __m128 _a128_1;
  float b;
  float a;
  float *ptr_1;
  int i_1;
  int size_1;
  __m128 _b128;
  __m128 _a128;
  __m128 _p128;
  __m256 _b256;
  __m256 _a256;
  __m256 _p256;
  __m512 _b512;
  __m512 _a512;
  __m512 _p512;
  int i;
  int size;
  float *bptr;
  float *aptr;
  float *ptr;
  int elempack;
  int c;
  int d;
  int h;
  int w;
  int dims;
  Mat *m;
  undefined1 local_1300 [64];
  undefined1 local_1260 [32];
  undefined8 local_1210;
  undefined8 uStack_1208;
  undefined1 local_11c0 [64];
  undefined1 local_1120 [32];
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 local_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 uStack_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  int local_1004;
  undefined1 (*local_ec0) [64];
  int local_eb8;
  undefined8 local_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 uStack_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  int local_e04;
  undefined1 (*local_ce0) [64];
  int local_cd8;
  undefined8 local_cb0;
  undefined8 uStack_ca8;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 uStack_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  int local_b58;
  undefined1 (*local_b50) [64];
  undefined1 (*local_b48) [64];
  undefined1 (*local_b40) [64];
  
  iVar15 = (int)in_RSI[5];
  iVar3 = *(int *)((long)in_RSI + 0x2c);
  lVar12 = in_RSI[6];
  iVar4 = *(int *)((long)in_RSI + 0x34);
  lVar13 = in_RSI[7];
  iVar5 = (int)in_RSI[3];
  if (iVar15 == 1) {
    local_b40 = (undefined1 (*) [64])*in_RSI;
    local_b48 = *(undefined1 (**) [64])(in_RDI + 0x1f8);
    local_b50 = *(undefined1 (**) [64])(in_RDI + 0x240);
    iVar14 = iVar3 * iVar5;
    for (local_b58 = 0; local_b58 + 0xf < iVar14; local_b58 = local_b58 + 0x10) {
      auVar17 = vfmadd213ps_avx512f(*local_b50,*local_b40,*local_b48);
      local_bc0 = auVar17._0_8_;
      uStack_bb8 = auVar17._8_8_;
      uStack_bb0 = auVar17._16_8_;
      uStack_ba8 = auVar17._24_8_;
      uStack_ba0 = auVar17._32_8_;
      uStack_b98 = auVar17._40_8_;
      uStack_b90 = auVar17._48_8_;
      uStack_b88 = auVar17._56_8_;
      *(undefined8 *)*local_b40 = local_bc0;
      *(undefined8 *)(*local_b40 + 8) = uStack_bb8;
      *(undefined8 *)(*local_b40 + 0x10) = uStack_bb0;
      *(undefined8 *)(*local_b40 + 0x18) = uStack_ba8;
      *(undefined8 *)(*local_b40 + 0x20) = uStack_ba0;
      *(undefined8 *)(*local_b40 + 0x28) = uStack_b98;
      *(undefined8 *)(*local_b40 + 0x30) = uStack_b90;
      *(undefined8 *)(*local_b40 + 0x38) = uStack_b88;
      local_b40 = local_b40 + 1;
      local_b48 = local_b48 + 1;
      local_b50 = local_b50 + 1;
    }
    for (; local_b58 + 7 < iVar14; local_b58 = local_b58 + 8) {
      auVar6 = vfmadd213ps_fma(*(undefined1 (*) [32])*local_b50,*(undefined1 (*) [32])*local_b40,
                               *(undefined1 (*) [32])*local_b48);
      local_c60 = auVar6._0_8_;
      uStack_c58 = auVar6._8_8_;
      *(undefined8 *)*local_b40 = local_c60;
      *(undefined8 *)(*local_b40 + 8) = uStack_c58;
      *(undefined8 *)(*local_b40 + 0x10) = 0;
      *(undefined8 *)(*local_b40 + 0x18) = 0;
      local_b40 = (undefined1 (*) [64])(*local_b40 + 0x20);
      local_b48 = (undefined1 (*) [64])(*local_b48 + 0x20);
      local_b50 = (undefined1 (*) [64])(*local_b50 + 0x20);
    }
    for (; local_b58 + 3 < iVar14; local_b58 = local_b58 + 4) {
      auVar6 = vfmadd213ps_fma(*(undefined1 (*) [16])*local_b50,*(undefined1 (*) [16])*local_b40,
                               *(undefined1 (*) [16])*local_b48);
      local_cb0 = auVar6._0_8_;
      uStack_ca8 = auVar6._8_8_;
      *(undefined8 *)*local_b40 = local_cb0;
      *(undefined8 *)(*local_b40 + 8) = uStack_ca8;
      local_b40 = (undefined1 (*) [64])(*local_b40 + 0x10);
      local_b48 = (undefined1 (*) [64])(*local_b48 + 0x10);
      local_b50 = (undefined1 (*) [64])(*local_b50 + 0x10);
    }
    for (; local_b58 < iVar14; local_b58 = local_b58 + 1) {
      *(float *)*local_b40 = *(float *)*local_b50 * *(float *)*local_b40 + *(float *)*local_b48;
      local_b40 = (undefined1 (*) [64])(*local_b40 + 4);
      local_b48 = (undefined1 (*) [64])(*local_b48 + 4);
      local_b50 = (undefined1 (*) [64])(*local_b50 + 4);
    }
  }
  if (iVar15 == 2) {
    iVar14 = iVar3 * iVar5;
    for (local_cd8 = 0; local_cd8 < (int)lVar12; local_cd8 = local_cd8 + 1) {
      local_ce0 = (undefined1 (*) [64])
                  (*in_RSI + (long)*(int *)((long)in_RSI + 0x2c) * (long)local_cd8 * in_RSI[2]);
      fVar1 = *(float *)(*(long *)(in_RDI + 0x1f8) + (long)local_cd8 * 4);
      fVar2 = *(float *)(*(long *)(in_RDI + 0x240) + (long)local_cd8 * 4);
      if (iVar5 == 4) {
        puVar16 = (undefined8 *)(*(long *)(in_RDI + 0x1f8) + (long)(local_cd8 << 2) * 4);
        uVar7 = *puVar16;
        uVar8 = puVar16[1];
        puVar16 = (undefined8 *)(*(long *)(in_RDI + 0x240) + (long)(local_cd8 << 2) * 4);
        local_10e0 = *puVar16;
        uStack_10d8 = puVar16[1];
      }
      else {
        uVar7 = CONCAT44(fVar1,fVar1);
        uVar8 = CONCAT44(fVar1,fVar1);
        local_10e0 = CONCAT44(fVar2,fVar2);
        uStack_10d8 = CONCAT44(fVar2,fVar2);
      }
      if (iVar5 == 8) {
        auVar19 = *(undefined1 (*) [32])(*(long *)(in_RDI + 0x1f8) + (long)(local_cd8 << 3) * 4);
        local_1120 = *(undefined1 (*) [32])(*(long *)(in_RDI + 0x240) + (long)(local_cd8 << 3) * 4);
      }
      else {
        auVar19._8_8_ = uVar8;
        auVar19._0_8_ = uVar7;
        auVar19._24_8_ = uVar8;
        auVar19._16_8_ = uVar7;
        local_1120._8_8_ = uStack_10d8;
        local_1120._0_8_ = local_10e0;
        local_1120._24_8_ = uStack_10d8;
        local_1120._16_8_ = local_10e0;
      }
      if (iVar5 == 0x10) {
        auVar17 = *(undefined1 (*) [64])(*(long *)(in_RDI + 0x1f8) + (long)(local_cd8 << 4) * 4);
        local_11c0 = *(undefined1 (*) [64])(*(long *)(in_RDI + 0x240) + (long)(local_cd8 << 4) * 4);
      }
      else {
        auVar17 = vinsertf64x4_avx512f(ZEXT3264(auVar19),auVar19,1);
        local_11c0 = vinsertf64x4_avx512f(ZEXT3264(local_1120),local_1120,1);
      }
      for (local_e04 = 0; local_e04 + 0xf < iVar14; local_e04 = local_e04 + 0x10) {
        auVar18 = vfmadd213ps_avx512f(local_11c0,*local_ce0,auVar17);
        local_e80 = auVar18._0_8_;
        uStack_e78 = auVar18._8_8_;
        uStack_e70 = auVar18._16_8_;
        uStack_e68 = auVar18._24_8_;
        uStack_e60 = auVar18._32_8_;
        uStack_e58 = auVar18._40_8_;
        uStack_e50 = auVar18._48_8_;
        uStack_e48 = auVar18._56_8_;
        *(undefined8 *)*local_ce0 = local_e80;
        *(undefined8 *)(*local_ce0 + 8) = uStack_e78;
        *(undefined8 *)(*local_ce0 + 0x10) = uStack_e70;
        *(undefined8 *)(*local_ce0 + 0x18) = uStack_e68;
        *(undefined8 *)(*local_ce0 + 0x20) = uStack_e60;
        *(undefined8 *)(*local_ce0 + 0x28) = uStack_e58;
        *(undefined8 *)(*local_ce0 + 0x30) = uStack_e50;
        *(undefined8 *)(*local_ce0 + 0x38) = uStack_e48;
        local_ce0 = local_ce0 + 1;
      }
      for (; local_e04 + 7 < iVar14; local_e04 = local_e04 + 8) {
        auVar6 = vfmadd213ps_fma(local_1120,*(undefined1 (*) [32])*local_ce0,auVar19);
        local_ea0 = auVar6._0_8_;
        uStack_e98 = auVar6._8_8_;
        *(undefined8 *)*local_ce0 = local_ea0;
        *(undefined8 *)(*local_ce0 + 8) = uStack_e98;
        *(undefined8 *)(*local_ce0 + 0x10) = 0;
        *(undefined8 *)(*local_ce0 + 0x18) = 0;
        local_ce0 = (undefined1 (*) [64])(*local_ce0 + 0x20);
      }
      for (; local_e04 + 3 < iVar14; local_e04 = local_e04 + 4) {
        auVar6._8_8_ = uStack_10d8;
        auVar6._0_8_ = local_10e0;
        auVar11._8_8_ = uVar8;
        auVar11._0_8_ = uVar7;
        auVar6 = vfmadd213ps_fma(auVar6,*(undefined1 (*) [16])*local_ce0,auVar11);
        local_eb0 = auVar6._0_8_;
        uStack_ea8 = auVar6._8_8_;
        *(undefined8 *)*local_ce0 = local_eb0;
        *(undefined8 *)(*local_ce0 + 8) = uStack_ea8;
        local_ce0 = (undefined1 (*) [64])(*local_ce0 + 0x10);
      }
      for (; local_e04 < iVar14; local_e04 = local_e04 + 1) {
        *(float *)*local_ce0 = fVar2 * *(float *)*local_ce0 + fVar1;
        local_ce0 = (undefined1 (*) [64])(*local_ce0 + 4);
      }
    }
  }
  if ((iVar15 == 3) || (iVar15 == 4)) {
    iVar15 = iVar3 * (int)lVar12 * iVar4 * iVar5;
    for (local_eb8 = 0; local_eb8 < (int)lVar13; local_eb8 = local_eb8 + 1) {
      local_ec0 = (undefined1 (*) [64])(*in_RSI + in_RSI[8] * (long)local_eb8 * in_RSI[2]);
      fVar1 = *(float *)(*(long *)(in_RDI + 0x1f8) + (long)local_eb8 * 4);
      fVar2 = *(float *)(*(long *)(in_RDI + 0x240) + (long)local_eb8 * 4);
      if (iVar5 == 4) {
        puVar16 = (undefined8 *)(*(long *)(in_RDI + 0x1f8) + (long)(local_eb8 << 2) * 4);
        uVar7 = *puVar16;
        uVar8 = puVar16[1];
        puVar16 = (undefined8 *)(*(long *)(in_RDI + 0x240) + (long)(local_eb8 << 2) * 4);
        local_1210 = *puVar16;
        uStack_1208 = puVar16[1];
      }
      else {
        uVar7 = CONCAT44(fVar1,fVar1);
        uVar8 = CONCAT44(fVar1,fVar1);
        local_1210 = CONCAT44(fVar2,fVar2);
        uStack_1208 = CONCAT44(fVar2,fVar2);
      }
      if (iVar5 == 8) {
        auVar20 = *(undefined1 (*) [32])(*(long *)(in_RDI + 0x1f8) + (long)(local_eb8 << 3) * 4);
        local_1260 = *(undefined1 (*) [32])(*(long *)(in_RDI + 0x240) + (long)(local_eb8 << 3) * 4);
      }
      else {
        auVar20._8_8_ = uVar8;
        auVar20._0_8_ = uVar7;
        auVar20._24_8_ = uVar8;
        auVar20._16_8_ = uVar7;
        local_1260._8_8_ = uStack_1208;
        local_1260._0_8_ = local_1210;
        local_1260._24_8_ = uStack_1208;
        local_1260._16_8_ = local_1210;
      }
      if (iVar5 == 0x10) {
        auVar17 = *(undefined1 (*) [64])(*(long *)(in_RDI + 0x1f8) + (long)(local_eb8 << 4) * 4);
        local_1300 = *(undefined1 (*) [64])(*(long *)(in_RDI + 0x240) + (long)(local_eb8 << 4) * 4);
      }
      else {
        auVar17 = vinsertf64x4_avx512f(ZEXT3264(auVar20),auVar20,1);
        local_1300 = vinsertf64x4_avx512f(ZEXT3264(local_1260),local_1260,1);
      }
      for (local_1004 = 0; local_1004 + 0xf < iVar15; local_1004 = local_1004 + 0x10) {
        auVar18 = vfmadd213ps_avx512f(local_1300,*local_ec0,auVar17);
        local_1080 = auVar18._0_8_;
        uStack_1078 = auVar18._8_8_;
        uStack_1070 = auVar18._16_8_;
        uStack_1068 = auVar18._24_8_;
        uStack_1060 = auVar18._32_8_;
        uStack_1058 = auVar18._40_8_;
        uStack_1050 = auVar18._48_8_;
        uStack_1048 = auVar18._56_8_;
        *(undefined8 *)*local_ec0 = local_1080;
        *(undefined8 *)(*local_ec0 + 8) = uStack_1078;
        *(undefined8 *)(*local_ec0 + 0x10) = uStack_1070;
        *(undefined8 *)(*local_ec0 + 0x18) = uStack_1068;
        *(undefined8 *)(*local_ec0 + 0x20) = uStack_1060;
        *(undefined8 *)(*local_ec0 + 0x28) = uStack_1058;
        *(undefined8 *)(*local_ec0 + 0x30) = uStack_1050;
        *(undefined8 *)(*local_ec0 + 0x38) = uStack_1048;
        local_ec0 = local_ec0 + 1;
      }
      for (; local_1004 + 7 < iVar15; local_1004 = local_1004 + 8) {
        auVar6 = vfmadd213ps_fma(local_1260,*(undefined1 (*) [32])*local_ec0,auVar20);
        local_10a0 = auVar6._0_8_;
        uStack_1098 = auVar6._8_8_;
        *(undefined8 *)*local_ec0 = local_10a0;
        *(undefined8 *)(*local_ec0 + 8) = uStack_1098;
        *(undefined8 *)(*local_ec0 + 0x10) = 0;
        *(undefined8 *)(*local_ec0 + 0x18) = 0;
        local_ec0 = (undefined1 (*) [64])(*local_ec0 + 0x20);
      }
      for (; local_1004 + 3 < iVar15; local_1004 = local_1004 + 4) {
        auVar9._8_8_ = uStack_1208;
        auVar9._0_8_ = local_1210;
        auVar10._8_8_ = uVar8;
        auVar10._0_8_ = uVar7;
        auVar6 = vfmadd213ps_fma(auVar9,*(undefined1 (*) [16])*local_ec0,auVar10);
        local_10b0 = auVar6._0_8_;
        uStack_10a8 = auVar6._8_8_;
        *(undefined8 *)*local_ec0 = local_10b0;
        *(undefined8 *)(*local_ec0 + 8) = uStack_10a8;
        local_ec0 = (undefined1 (*) [64])(*local_ec0 + 0x10);
      }
      for (; local_1004 < iVar15; local_1004 = local_1004 + 1) {
        *(float *)*local_ec0 = fVar2 * *(float *)*local_ec0 + fVar1;
        local_ec0 = (undefined1 (*) [64])(*local_ec0 + 4);
      }
    }
  }
  return 0;
}

Assistant:

int BatchNorm_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int c = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;

    if (dims == 1)
    {
        float* ptr = bottom_top_blob;
        const float* aptr = a_data;
        const float* bptr = b_data;

        const int size = w * elempack;

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p512 = _mm512_loadu_ps(ptr);
            __m512 _a512 = _mm512_loadu_ps(aptr);
            __m512 _b512 = _mm512_loadu_ps(bptr);
            _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
            _mm512_storeu_ps(ptr, _p512);
            ptr += 16;
            aptr += 16;
            bptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p256 = _mm256_loadu_ps(ptr);
            __m256 _a256 = _mm256_loadu_ps(aptr);
            __m256 _b256 = _mm256_loadu_ps(bptr);
            _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
            _mm256_storeu_ps(ptr, _p256);
            ptr += 8;
            aptr += 8;
            bptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p128 = _mm_loadu_ps(ptr);
            __m128 _a128 = _mm_loadu_ps(aptr);
            __m128 _b128 = _mm_loadu_ps(bptr);
            _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
            _mm_storeu_ps(ptr, _p128);
            ptr += 4;
            aptr += 4;
            bptr += 4;
        }
#endif // __SSE__
        for (; i < size; i++)
        {
            *ptr = *bptr * *ptr + *aptr;
            ptr++;
            aptr++;
            bptr++;
        }
    }

    if (dims == 2)
    {
        const int size = w * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            float a = a_data[i];
            float b = b_data[i];

#if __SSE2__
            __m128 _a128 = (elempack == 4) ? _mm_loadu_ps((const float*)a_data + i * 4) : _mm_set1_ps(a);
            __m128 _b128 = (elempack == 4) ? _mm_loadu_ps((const float*)b_data + i * 4) : _mm_set1_ps(b);
#if __AVX__
            __m256 _a256 = (elempack == 8) ? _mm256_loadu_ps((const float*)a_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_a128), _a128, 1);
            __m256 _b256 = (elempack == 8) ? _mm256_loadu_ps((const float*)b_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b128), _b128, 1);
#if __AVX512F__
            __m512 _a512 = (elempack == 16) ? _mm512_loadu_ps((const float*)a_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_a256), _a256, 1);
            __m512 _b512 = (elempack == 16) ? _mm512_loadu_ps((const float*)b_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b256), _b256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

            int j = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; j + 15 < size; j += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
                _mm512_storeu_ps(ptr, _p512);
                ptr += 16;
            }
#endif // __AVX512F__
            for (; j + 7 < size; j += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
                _mm256_storeu_ps(ptr, _p256);
                ptr += 8;
            }
#endif // __AVX__
            for (; j + 3 < size; j += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
                _mm_storeu_ps(ptr, _p128);
                ptr += 4;
            }
#endif // __SSE__
            for (; j < size; j++)
            {
                *ptr = b * *ptr + a;
                ptr++;
            }
        }
    }

    if (dims == 3 || dims == 4)
    {
        const int size = w * h * d * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float a = a_data[q];
            float b = b_data[q];

#if __SSE2__
            __m128 _a128 = (elempack == 4) ? _mm_loadu_ps((const float*)a_data + q * 4) : _mm_set1_ps(a);
            __m128 _b128 = (elempack == 4) ? _mm_loadu_ps((const float*)b_data + q * 4) : _mm_set1_ps(b);
#if __AVX__
            __m256 _a256 = (elempack == 8) ? _mm256_loadu_ps((const float*)a_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_a128), _a128, 1);
            __m256 _b256 = (elempack == 8) ? _mm256_loadu_ps((const float*)b_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b128), _b128, 1);
#if __AVX512F__
            __m512 _a512 = (elempack == 16) ? _mm512_loadu_ps((const float*)a_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_a256), _a256, 1);
            __m512 _b512 = (elempack == 16) ? _mm512_loadu_ps((const float*)b_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b256), _b256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
                _mm512_storeu_ps(ptr, _p512);
                ptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
                _mm256_storeu_ps(ptr, _p256);
                ptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
                _mm_storeu_ps(ptr, _p128);
                ptr += 4;
            }
#endif // __SSE__
            for (; i < size; i++)
            {
                *ptr = b * *ptr + a;
                ptr++;
            }
        }
    }

    return 0;
}